

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt,int inputchk,int depth)

{
  byte bVar1;
  xmlChar xVar2;
  int iVar3;
  xmlElementContentPtr cur;
  _xmlElementContent *p_Var4;
  xmlParserInputPtr pxVar5;
  xmlElementContentPtr cur_00;
  xmlChar *pxVar6;
  _xmlElementContent *p_Var7;
  uint val;
  long lVar8;
  byte bVar9;
  bool bVar10;
  
  if ((0x80 < depth) && ((0x800 < (uint)depth || ((ctxt->options & 0x80000U) == 0)))) {
    xmlFatalErrMsgInt(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,
                      "xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n"
                      ,depth);
    return (xmlElementContentPtr)0x0;
  }
  xmlSkipBlankChars(ctxt);
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  if (*ctxt->input->cur == '(') {
    iVar3 = ctxt->input->id;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
    cur = xmlParseElementChildrenContentDeclPriv(ctxt,iVar3,depth + 1);
    if (cur == (xmlElementContentPtr)0x0) {
      return (xmlElementContentPtr)0x0;
    }
    xmlSkipBlankChars(ctxt);
    if (ctxt->progressive != 0) goto LAB_0015bb6c;
    lVar8 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  else {
    pxVar6 = xmlParseName(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    cur = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
    if (cur == (xmlElementContentPtr)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return (xmlElementContentPtr)0x0;
    }
    pxVar5 = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlGROW(ctxt);
      pxVar5 = ctxt->input;
    }
    xVar2 = *pxVar5->cur;
    if (xVar2 == '*') {
      cur->ocur = XML_ELEMENT_CONTENT_MULT;
LAB_0015bb33:
      xmlNextChar(ctxt);
    }
    else {
      if (xVar2 == '+') {
        cur->ocur = XML_ELEMENT_CONTENT_PLUS;
        goto LAB_0015bb33;
      }
      if (xVar2 == '?') {
        cur->ocur = XML_ELEMENT_CONTENT_OPT;
        goto LAB_0015bb33;
      }
      cur->ocur = XML_ELEMENT_CONTENT_ONCE;
    }
    if (ctxt->progressive != 0) goto LAB_0015bb6c;
    lVar8 = (long)ctxt->input->end - (long)ctxt->input->cur;
  }
  if (lVar8 < 0xfa) {
    xmlGROW(ctxt);
  }
LAB_0015bb6c:
  xmlSkipBlankChars(ctxt);
  if (ctxt->progressive == 0) {
    pxVar5 = ctxt->input;
    if ((500 < (long)pxVar5->cur - (long)pxVar5->base) &&
       ((long)pxVar5->end - (long)pxVar5->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  cur_00 = (xmlElementContentPtr)0x0;
  p_Var7 = cur;
  bVar9 = 0;
  do {
    pxVar5 = ctxt->input;
    bVar1 = *pxVar5->cur;
    if ((bVar1 == 0x29) || (ctxt->instate == XML_PARSER_EOF)) {
      if (cur_00 != (xmlElementContentPtr)0x0) {
        p_Var7->c2 = cur_00;
        cur_00->parent = p_Var7;
      }
      if (pxVar5->id != inputchk) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn\'t start and stop in the same entity\n");
      }
      xmlNextChar(ctxt);
      xVar2 = *ctxt->input->cur;
      if (xVar2 == '*') {
        if (cur != (_xmlElementContent *)0x0) {
          cur->ocur = XML_ELEMENT_CONTENT_MULT;
          p_Var7 = cur;
          while ((p_Var7 != (_xmlElementContent *)0x0 && (p_Var7->type == XML_ELEMENT_CONTENT_OR)))
          {
            p_Var4 = p_Var7->c1;
            if ((p_Var4 != (_xmlElementContent *)0x0) &&
               ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
            p_Var7 = p_Var7->c2;
            if ((p_Var7 != (_xmlElementContent *)0x0) &&
               ((p_Var7->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var7->ocur = XML_ELEMENT_CONTENT_ONCE;
            }
          }
        }
      }
      else if (xVar2 == '+') {
        if (cur != (_xmlElementContent *)0x0) {
          cur->ocur = ((cur->ocur & ~XML_ELEMENT_CONTENT_ONCE) != XML_ELEMENT_CONTENT_OPT) +
                      XML_ELEMENT_CONTENT_MULT;
          bVar10 = false;
          while ((p_Var7 != (xmlElementContentPtr)0x0 && (p_Var7->type == XML_ELEMENT_CONTENT_OR)))
          {
            p_Var4 = p_Var7->c1;
            if ((p_Var4 != (_xmlElementContent *)0x0) &&
               ((p_Var4->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var4->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar10 = true;
            }
            p_Var7 = p_Var7->c2;
            if ((p_Var7 != (_xmlElementContent *)0x0) &&
               ((p_Var7->ocur & ~XML_ELEMENT_CONTENT_ONCE) == XML_ELEMENT_CONTENT_OPT)) {
              p_Var7->ocur = XML_ELEMENT_CONTENT_ONCE;
              bVar10 = true;
            }
          }
          if (bVar10) {
            cur->ocur = XML_ELEMENT_CONTENT_MULT;
          }
        }
      }
      else {
        if (xVar2 != '?') {
          return cur;
        }
        if (cur != (_xmlElementContent *)0x0) {
          cur->ocur = (cur->ocur - XML_ELEMENT_CONTENT_MULT < 2) + XML_ELEMENT_CONTENT_OPT;
        }
      }
      xmlNextChar(ctxt);
      return cur;
    }
    val = (uint)bVar9;
    if (bVar1 != 0x7c) {
      if (bVar1 == 0x2c) {
        if ((bVar9 == 0) || (val == 0x2c)) {
          xmlNextChar(ctxt);
          p_Var4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_SEQ);
          if (p_Var4 == (xmlElementContentPtr)0x0) {
            if ((cur_00 != (xmlElementContentPtr)0x0) && (cur_00 != cur)) {
              xmlFreeDocElementContent(ctxt->myDoc,cur_00);
            }
            goto LAB_0015bf47;
          }
          goto LAB_0015bc4a;
        }
        goto LAB_0015bf1a;
      }
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_FINISHED,(char *)0x0);
LAB_0015bf2c:
      if ((cur_00 != (xmlElementContentPtr)0x0) && (cur_00 != cur)) {
        xmlFreeDocElementContent(ctxt->myDoc,cur_00);
      }
LAB_0015bf42:
      if (cur == (_xmlElementContent *)0x0) {
        return (xmlElementContentPtr)0x0;
      }
LAB_0015bf47:
      xmlFreeDocElementContent(ctxt->myDoc,cur);
      return (xmlElementContentPtr)0x0;
    }
    if ((bVar9 != 0) && (val != 0x7c)) {
LAB_0015bf1a:
      xmlFatalErrMsgInt(ctxt,XML_ERR_SEPARATOR_REQUIRED,
                        "xmlParseElementChildrenContentDecl : \'%c\' expected\n",val);
      goto LAB_0015bf2c;
    }
    xmlNextChar(ctxt);
    p_Var4 = xmlNewDocElementContent(ctxt->myDoc,(xmlChar *)0x0,XML_ELEMENT_CONTENT_OR);
    if (p_Var4 == (xmlElementContentPtr)0x0) goto LAB_0015bf2c;
LAB_0015bc4a:
    if (cur_00 == (xmlElementContentPtr)0x0) {
      p_Var4->c1 = cur;
      bVar10 = cur != (_xmlElementContent *)0x0;
      cur_00 = cur;
      cur = p_Var4;
      if (bVar10) goto LAB_0015bc70;
    }
    else {
      p_Var7->c2 = p_Var4;
      p_Var4->parent = p_Var7;
      p_Var4->c1 = cur_00;
LAB_0015bc70:
      cur_00->parent = p_Var4;
    }
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    pxVar5 = ctxt->input;
    if ((ctxt->progressive == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlGROW(ctxt);
      pxVar5 = ctxt->input;
    }
    if (*pxVar5->cur == '(') {
      iVar3 = pxVar5->id;
      xmlNextChar(ctxt);
      xmlSkipBlankChars(ctxt);
      cur_00 = xmlParseElementChildrenContentDeclPriv(ctxt,iVar3,depth + 1);
      if (cur_00 != (xmlElementContentPtr)0x0) {
        xmlSkipBlankChars(ctxt);
        goto LAB_0015bd84;
      }
      goto LAB_0015bf42;
    }
    pxVar6 = xmlParseName(ctxt);
    if (pxVar6 == (xmlChar *)0x0) {
      xmlFatalErr(ctxt,XML_ERR_ELEMCONTENT_NOT_STARTED,(char *)0x0);
      if (cur == (_xmlElementContent *)0x0) {
        return (xmlElementContentPtr)0x0;
      }
      goto LAB_0015bf47;
    }
    cur_00 = xmlNewDocElementContent(ctxt->myDoc,pxVar6,XML_ELEMENT_CONTENT_ELEMENT);
    if (cur_00 == (xmlElementContentPtr)0x0) goto LAB_0015bf42;
    xVar2 = *ctxt->input->cur;
    if (xVar2 == '*') {
      cur_00->ocur = XML_ELEMENT_CONTENT_MULT;
    }
    else if (xVar2 == '+') {
      cur_00->ocur = XML_ELEMENT_CONTENT_PLUS;
    }
    else {
      if (xVar2 != '?') {
        cur_00->ocur = XML_ELEMENT_CONTENT_ONCE;
        goto LAB_0015bd84;
      }
      cur_00->ocur = XML_ELEMENT_CONTENT_OPT;
    }
    xmlNextChar(ctxt);
LAB_0015bd84:
    xmlSkipBlankChars(ctxt);
    p_Var7 = p_Var4;
    bVar9 = bVar1;
    if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlGROW(ctxt);
    }
  } while( true );
}

Assistant:

static xmlElementContentPtr
xmlParseElementChildrenContentDeclPriv(xmlParserCtxtPtr ctxt, int inputchk,
                                       int depth) {
    xmlElementContentPtr ret = NULL, cur = NULL, last = NULL, op = NULL;
    const xmlChar *elem;
    xmlChar type = 0;

    if (((depth > 128) && ((ctxt->options & XML_PARSE_HUGE) == 0)) ||
        (depth >  2048)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED,
"xmlParseElementChildrenContentDecl : depth %d too deep, use XML_PARSE_HUGE\n",
                          depth);
	return(NULL);
    }
    SKIP_BLANKS;
    GROW;
    if (RAW == '(') {
	int inputid = ctxt->input->id;

        /* Recurse on first child */
	NEXT;
	SKIP_BLANKS;
        cur = ret = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                           depth + 1);
        if (cur == NULL)
            return(NULL);
	SKIP_BLANKS;
	GROW;
    } else {
	elem = xmlParseName(ctxt);
	if (elem == NULL) {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
	    return(NULL);
	}
        cur = ret = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	if (cur == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    return(NULL);
	}
	GROW;
	if (RAW == '?') {
	    cur->ocur = XML_ELEMENT_CONTENT_OPT;
	    NEXT;
	} else if (RAW == '*') {
	    cur->ocur = XML_ELEMENT_CONTENT_MULT;
	    NEXT;
	} else if (RAW == '+') {
	    cur->ocur = XML_ELEMENT_CONTENT_PLUS;
	    NEXT;
	} else {
	    cur->ocur = XML_ELEMENT_CONTENT_ONCE;
	}
	GROW;
    }
    SKIP_BLANKS;
    SHRINK;
    while ((RAW != ')') && (ctxt->instate != XML_PARSER_EOF)) {
        /*
	 * Each loop we parse one separator and one element.
	 */
        if (RAW == ',') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name | Name , Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
		                  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_SEQ);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
	        xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else if (RAW == '|') {
	    if (type == 0) type = CUR;

	    /*
	     * Detect "Name , Name | Name" error
	     */
	    else if (type != CUR) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_SEPARATOR_REQUIRED,
		    "xmlParseElementChildrenContentDecl : '%c' expected\n",
				  type);
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    NEXT;

	    op = xmlNewDocElementContent(ctxt->myDoc, NULL, XML_ELEMENT_CONTENT_OR);
	    if (op == NULL) {
		if ((last != NULL) && (last != ret))
		    xmlFreeDocElementContent(ctxt->myDoc, last);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (last == NULL) {
		op->c1 = ret;
		if (ret != NULL)
		    ret->parent = op;
		ret = cur = op;
	    } else {
	        cur->c2 = op;
		if (op != NULL)
		    op->parent = cur;
		op->c1 = last;
		if (last != NULL)
		    last->parent = op;
		cur =op;
		last = NULL;
	    }
	} else {
	    xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_FINISHED, NULL);
	    if ((last != NULL) && (last != ret))
	        xmlFreeDocElementContent(ctxt->myDoc, last);
	    if (ret != NULL)
		xmlFreeDocElementContent(ctxt->myDoc, ret);
	    return(NULL);
	}
	GROW;
	SKIP_BLANKS;
	GROW;
	if (RAW == '(') {
	    int inputid = ctxt->input->id;
	    /* Recurse on second child */
	    NEXT;
	    SKIP_BLANKS;
	    last = xmlParseElementChildrenContentDeclPriv(ctxt, inputid,
                                                          depth + 1);
            if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
            }
	    SKIP_BLANKS;
	} else {
	    elem = xmlParseName(ctxt);
	    if (elem == NULL) {
		xmlFatalErr(ctxt, XML_ERR_ELEMCONTENT_NOT_STARTED, NULL);
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    last = xmlNewDocElementContent(ctxt->myDoc, elem, XML_ELEMENT_CONTENT_ELEMENT);
	    if (last == NULL) {
		if (ret != NULL)
		    xmlFreeDocElementContent(ctxt->myDoc, ret);
		return(NULL);
	    }
	    if (RAW == '?') {
		last->ocur = XML_ELEMENT_CONTENT_OPT;
		NEXT;
	    } else if (RAW == '*') {
		last->ocur = XML_ELEMENT_CONTENT_MULT;
		NEXT;
	    } else if (RAW == '+') {
		last->ocur = XML_ELEMENT_CONTENT_PLUS;
		NEXT;
	    } else {
		last->ocur = XML_ELEMENT_CONTENT_ONCE;
	    }
	}
	SKIP_BLANKS;
	GROW;
    }
    if ((cur != NULL) && (last != NULL)) {
        cur->c2 = last;
	if (last != NULL)
	    last->parent = cur;
    }
    if (ctxt->input->id != inputchk) {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                       "Element content declaration doesn't start and stop in"
                       " the same entity\n");
    }
    NEXT;
    if (RAW == '?') {
	if (ret != NULL) {
	    if ((ret->ocur == XML_ELEMENT_CONTENT_PLUS) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_OPT;
	}
	NEXT;
    } else if (RAW == '*') {
	if (ret != NULL) {
	    ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    cur = ret;
	    /*
	     * Some normalization:
	     * (a | b* | c?)* == (a | b | c)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT)))
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		cur = cur->c2;
	    }
	}
	NEXT;
    } else if (RAW == '+') {
	if (ret != NULL) {
	    int found = 0;

	    if ((ret->ocur == XML_ELEMENT_CONTENT_OPT) ||
	        (ret->ocur == XML_ELEMENT_CONTENT_MULT))
	        ret->ocur = XML_ELEMENT_CONTENT_MULT;
	    else
	        ret->ocur = XML_ELEMENT_CONTENT_PLUS;
	    /*
	     * Some normalization:
	     * (a | b*)+ == (a | b)*
	     * (a | b?)+ == (a | b)*
	     */
	    while ((cur != NULL) && (cur->type == XML_ELEMENT_CONTENT_OR)) {
		if ((cur->c1 != NULL) &&
	            ((cur->c1->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c1->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c1->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		if ((cur->c2 != NULL) &&
	            ((cur->c2->ocur == XML_ELEMENT_CONTENT_OPT) ||
		     (cur->c2->ocur == XML_ELEMENT_CONTENT_MULT))) {
		    cur->c2->ocur = XML_ELEMENT_CONTENT_ONCE;
		    found = 1;
		}
		cur = cur->c2;
	    }
	    if (found)
		ret->ocur = XML_ELEMENT_CONTENT_MULT;
	}
	NEXT;
    }
    return(ret);
}